

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::get_extension(dynamic_string *filename)

{
  uint start;
  int iVar1;
  dynamic_string *in_RDI;
  int dot;
  int sep;
  
  start = dynamic_string::find_right(in_RDI,'/');
  iVar1 = dynamic_string::find_right(in_RDI,'.');
  if ((int)start <= iVar1) {
    dynamic_string::right(in_RDI,start);
  }
  else {
    dynamic_string::clear(in_RDI);
  }
  return (int)start <= iVar1;
}

Assistant:

bool file_utils::get_extension(dynamic_string& filename) {
  int sep = -1;
#ifdef WIN32
  sep = filename.find_right('\\');
#endif
  if (sep < 0)
    sep = filename.find_right('/');

  int dot = filename.find_right('.');
  if (dot < sep) {
    filename.clear();
    return false;
  }

  filename.right(dot + 1);

  return true;
}